

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_31::NetworkAddressHttpClient::applyTimeouts(NetworkAddressHttpClient *this)

{
  Disposer *pDVar1;
  _func_int *p_Var2;
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  _func_int **in_RSI;
  Promise<void> PVar4;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  if (in_RSI[0x12] == in_RSI[0xe]) {
    *(undefined1 *)((long)in_RSI + 0x4c) = 0;
    p_Var2 = in_RSI[8];
    if (p_Var2 != (_func_int *)0x0 && *(int *)(in_RSI + 9) == 0) {
      (*(code *)**(undefined8 **)p_Var2)(p_Var2,&intermediate);
      intermediate.disposer = (Disposer *)0x0;
      intermediate.ptr = (PromiseNode *)0x0;
      Own<kj::PromiseFulfiller<void>_>::operator=
                ((Own<kj::PromiseFulfiller<void>_> *)(in_RSI + 7),
                 (Own<kj::PromiseFulfiller<void>_> *)&intermediate);
      Own<kj::PromiseFulfiller<void>_>::dispose((Own<kj::PromiseFulfiller<void>_> *)&intermediate);
    }
    Promise<void>::Promise((Promise<void> *)this);
    pPVar3 = extraout_RDX_00;
  }
  else {
    pDVar1 = *(Disposer **)(in_RSI[0xe] + 0x10);
    (**(code **)(*(long *)in_RSI[1] + 8))(&local_50,in_RSI[1],pDVar1);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_50,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3719:38),_kj::_::PropagateException>
               ::anon_class_16_2_3fe63c88_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042ab60;
    this_00[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
    this_00[1].dependency.disposer = pDVar1;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this_00;
    _::maybeChain<void>(&local_40,(Promise<void> *)&intermediate);
    pPVar3 = local_40.ptr;
    local_30.disposer = local_40.disposer;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    (this->super_HttpClient)._vptr_HttpClient = (_func_int **)local_40.disposer;
    this->timer = (Timer *)pPVar3;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_30);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose(&local_50);
    pPVar3 = extraout_RDX;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> applyTimeouts() {
    if (availableClients.empty()) {
      timeoutsScheduled = false;
      if (activeConnectionCount == 0) {
        KJ_IF_MAYBE(f, drainedFulfiller) {
          f->get()->fulfill();
          drainedFulfiller = nullptr;
        }
      }
      return kj::READY_NOW;
    } else {
      auto time = availableClients.front().expires;
      return timer.atTime(time).then([this,time]() {
        while (!availableClients.empty() && availableClients.front().expires <= time) {
          availableClients.pop_front();
        }
        return applyTimeouts();
      });
    }
  }